

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adapter.cpp
# Opt level: O2

void msocket::set_handler(msocket_t *msocket,Handler *handler)

{
  msocket_handler_t handler_struct;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  code *local_18;
  undefined8 uStack_10;
  
  if (handler != (Handler *)0x0 && msocket != (msocket_t *)0x0) {
    uStack_10 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_28 = msocket_adapter_tcp_connected;
    pcStack_20 = msocket_adapter_tcp_disconnected;
    local_18 = msocket_adapter_tcp_data;
    msocket_set_handler(msocket,&local_38,handler);
  }
  return;
}

Assistant:

void set_handler(msocket_t* msocket, Handler* handler)
   {
      if ((msocket != nullptr) && (handler != nullptr))
      {
         msocket_handler_t handler_struct;
         std::memset(&handler_struct, 0, sizeof(handler_struct));
         handler_struct.tcp_connected = msocket_adapter_tcp_connected;
         handler_struct.tcp_disconnected = msocket_adapter_tcp_disconnected;
         handler_struct.tcp_data = msocket_adapter_tcp_data;
         msocket_set_handler(msocket, &handler_struct, reinterpret_cast<void*>(handler));
      }
   }